

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O3

bool __thiscall ScapeGoatTree::insertElement(ScapeGoatTree *this,int value)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  
  pNVar5 = (Node *)operator_new(0x20);
  pNVar5->value = value;
  pNVar5->rightChild = (Node *)0x0;
  pNVar5->leftChild = (Node *)0x0;
  pNVar5->parent = (Node *)0x0;
  iVar2 = addWithDepth(this,pNVar5);
  dVar1 = log((double)this->q);
  dVar1 = ceil(dVar1 * 2.4663034623764317);
  if ((int)dVar1 < iVar2) {
    pNVar5 = pNVar5->parent;
    do {
      iVar3 = size(this,pNVar5);
      iVar3 = iVar3 * 3;
      pNVar5 = pNVar5->parent;
      iVar4 = size(this,pNVar5);
    } while (iVar3 == iVar4 * 2 || SBORROW4(iVar3,iVar4 * 2) != iVar3 + iVar4 * -2 < 0);
    rebuild(this,pNVar5);
  }
  return -1 < iVar2;
}

Assistant:

bool ScapeGoatTree::insertElement(int value) {
    /* first do basic insertion keeping track of depth */
    auto *u = new Node(value);
    int d = addWithDepth(u);
    if (d > log32(q)) {
        /* depth exceeded, find scapegoat */
        Node *w = u->parent;
        while (3 * size(w) <= 2 * size(w->parent)) {
            w = w->parent;
        }
        rebuild(w->parent);
    }
    return d >= 0;
}